

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O1

void __thiscall DynamicGraph::deleteEdge(DynamicGraph *this,Vertex *v,Vertex *u)

{
  Vertex VVar1;
  pointer psVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> e;
  Edge e_00;
  __normal_iterator<const_boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>
  _Var5;
  invalid_argument *this_00;
  code *pcVar6;
  Graph *cg;
  undefined *puVar7;
  _List_node_base *p_Var8;
  Vertex local_40;
  unsigned_long uStack_38;
  _List_node_base *local_30;
  
  if (this->isInitialized == false) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)this_00,"Dynamic Graph not initialized!");
    puVar7 = &std::runtime_error::typeinfo;
    pcVar6 = std::runtime_error::~runtime_error;
  }
  else {
    VVar1 = *v;
    local_40 = *u;
    psVar2 = (this->super_UndirectedGraph).super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uStack_38 = 0;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                      (*(undefined8 *)
                        &psVar2[VVar1].super_StoredVertex.m_out_edges.
                         super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                       ,*(pointer *)
                         ((long)&psVar2[VVar1].super_StoredVertex.m_out_edges.
                                 super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                         + 8));
    if (_Var5._M_current !=
        *(pointer *)
         ((long)&psVar2[VVar1].super_StoredVertex.m_out_edges.
                 super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
         + 8)) {
      uVar3 = *v;
      uVar4 = *u;
      psVar2 = (this->super_UndirectedGraph).super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uStack_38 = 0;
      local_40 = uVar4;
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                        (*(undefined8 *)
                          &psVar2[uVar3].super_StoredVertex.m_out_edges.
                           super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                         ,*(pointer *)
                           ((long)&psVar2[uVar3].super_StoredVertex.m_out_edges.
                                   super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                           + 8),&local_40);
      p_Var8 = ((_Var5._M_current)->m_iter)._M_node + 2;
      e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = uVar4;
      e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = uVar3;
      e.m_eproperty = p_Var8;
      local_40 = uVar3;
      uStack_38 = uVar4;
      local_30 = p_Var8;
      boost::detail::remove_undirected_edge_dispatch<boost::no_property>::
      apply<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>
                (e,(undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>
                    *)this,(no_property *)p_Var8);
      e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = uVar4;
      e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = uVar3;
      e_00.m_eproperty = p_Var8;
      handleDeletion(this,e_00);
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Edge does not exist");
    puVar7 = &std::invalid_argument::typeinfo;
    pcVar6 = std::invalid_argument::~invalid_argument;
  }
  __cxa_throw(this_00,puVar7,pcVar6);
}

Assistant:

void DynamicGraph::deleteEdge(const Vertex &v, const Vertex &u)
{
    if(!this->isInitialized) {
        throw std::runtime_error("Dynamic Graph not initialized!");
    }

    bool edgeExist = edge(v,u,*this).second;
    if (!edgeExist) {
        throw std::invalid_argument("Edge does not exist");
    }
    Edge e = edge(v,u,*this).first;
    boost::remove_edge(e, *this);
    this->handleDeletion(e);
}